

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

void __thiscall soplex::SVectorBase<double>::add(SVectorBase<double> *this,int i,double *v)

{
  double dVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  
  dVar1 = *v;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    iVar2 = this->memused;
    pNVar3 = this->m_elem;
    pNVar3[iVar2].idx = i;
    pNVar3[iVar2].val = dVar1;
    this->memused = iVar2 + 1;
  }
  return;
}

Assistant:

void add(int i, const R& v)
   {
      assert(m_elem != nullptr);
      assert(size() < max());

      if(v != 0.0)
      {
         int n = size();

         m_elem[n].idx = i;
         m_elem[n].val = v;
         set_size(n + 1);

         assert(size() <= max());
      }
   }